

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_vm_exec(unqlite_vm *pVm)

{
  jx9_vm *pVm_00;
  int iVar1;
  
  iVar1 = -0x18;
  if ((pVm != (unqlite_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) {
    pVm_00 = pVm->pJx9Vm;
    if (pVm_00->nMagic != 0xba851227) {
      iVar1 = -0x18;
      if (pVm_00->nMagic == 0xcdfe1dad) {
        iVar1 = -4;
      }
      return iVar1;
    }
    pVm_00->nMagic = 0xcdfe1dad;
    VmByteCodeExec(pVm_00,(VmInstr *)pVm_00->pByteContainer->pBase,pVm_00->aOps,-1,&pVm_00->sExec);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int unqlite_vm_exec(unqlite_vm *pVm)
{
	int rc;
	if( UNQLITE_VM_MISUSE(pVm) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_VM_RELEASE(pVm) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	/* Execute the Jx9 bytecode program */
	 rc = jx9VmByteCodeExec(pVm->pJx9Vm);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}